

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O2

void __thiscall antlr::InputBuffer::rewind(InputBuffer *this,FILE *__stream)

{
  syncConsume(this);
  this->markerOffset = (uint)__stream;
  this->nMarkers = this->nMarkers - 1;
  return;
}

Assistant:

void InputBuffer::rewind(unsigned int mark)
{
	syncConsume();
	markerOffset = mark;
	nMarkers--;
}